

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void gray_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  JSAMPLE JVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  JSAMPARRAY ppJVar4;
  JSAMPIMAGE pppJVar5;
  uint uVar6;
  JSAMPROW inptr_1;
  JDIMENSION num_cols_2;
  JDIMENSION col_2;
  JSAMPROW outptr_2;
  JSAMPROW inptr_2;
  JDIMENSION num_cols_3;
  JDIMENSION col_3;
  JSAMPROW outptr_3;
  JSAMPROW inptr_3;
  JDIMENSION num_cols_4;
  JDIMENSION col_4;
  JSAMPROW outptr_4;
  JSAMPROW inptr_4;
  JDIMENSION num_cols_5;
  JDIMENSION col_5;
  JSAMPROW outptr_5;
  JSAMPROW inptr_5;
  JDIMENSION num_cols_6;
  JDIMENSION col_6;
  JSAMPROW outptr_6;
  JSAMPROW inptr_6;
  uint local_1bc;
  JSAMPROW local_1b8;
  int local_1a4;
  JSAMPARRAY local_1a0;
  uint local_194;
  uint local_17c;
  JSAMPROW local_178;
  int local_164;
  JSAMPARRAY local_160;
  uint local_154;
  uint local_13c;
  JSAMPROW local_138;
  int local_124;
  JSAMPARRAY local_120;
  uint local_114;
  uint local_fc;
  JSAMPROW local_f8;
  int local_e4;
  JSAMPARRAY local_e0;
  uint local_d4;
  uint local_bc;
  JSAMPROW local_b8;
  int local_a4;
  JSAMPARRAY local_a0;
  uint local_94;
  uint local_7c;
  JSAMPARRAY ppJStack_78;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPROW local_38;
  int local_24;
  JSAMPARRAY local_20;
  uint local_14;
  JDIMENSION num_cols_1;
  JDIMENSION col_1;
  JSAMPROW outptr_1;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    uVar2 = cinfo->output_width;
    local_1a4 = num_rows;
    local_1a0 = output_buf;
    local_194 = input_row;
    while (local_1a4 = local_1a4 + -1, -1 < local_1a4) {
      uVar6 = local_194 + 1;
      pJVar3 = (*input_buf)[local_194];
      ppJVar4 = local_1a0 + 1;
      local_1b8 = *local_1a0;
      for (local_1bc = 0; local_1a0 = ppJVar4, local_194 = uVar6, local_1bc < uVar2;
          local_1bc = local_1bc + 1) {
        JVar1 = pJVar3[local_1bc];
        local_1b8[2] = JVar1;
        local_1b8[1] = JVar1;
        *local_1b8 = JVar1;
        local_1b8 = local_1b8 + 3;
      }
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    uVar2 = cinfo->output_width;
    local_164 = num_rows;
    local_160 = output_buf;
    local_154 = input_row;
    while (local_164 = local_164 + -1, -1 < local_164) {
      uVar6 = local_154 + 1;
      pJVar3 = (*input_buf)[local_154];
      ppJVar4 = local_160 + 1;
      local_178 = *local_160;
      for (local_17c = 0; local_160 = ppJVar4, local_154 = uVar6, local_17c < uVar2;
          local_17c = local_17c + 1) {
        JVar1 = pJVar3[local_17c];
        local_178[2] = JVar1;
        local_178[1] = JVar1;
        *local_178 = JVar1;
        local_178[3] = 0xff;
        local_178 = local_178 + 4;
      }
    }
    break;
  case JCS_EXT_BGR:
    uVar2 = cinfo->output_width;
    local_124 = num_rows;
    local_120 = output_buf;
    local_114 = input_row;
    while (local_124 = local_124 + -1, -1 < local_124) {
      uVar6 = local_114 + 1;
      pJVar3 = (*input_buf)[local_114];
      ppJVar4 = local_120 + 1;
      local_138 = *local_120;
      for (local_13c = 0; local_120 = ppJVar4, local_114 = uVar6, local_13c < uVar2;
          local_13c = local_13c + 1) {
        JVar1 = pJVar3[local_13c];
        *local_138 = JVar1;
        local_138[1] = JVar1;
        local_138[2] = JVar1;
        local_138 = local_138 + 3;
      }
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    uVar2 = cinfo->output_width;
    local_e4 = num_rows;
    local_e0 = output_buf;
    local_d4 = input_row;
    while (local_e4 = local_e4 + -1, -1 < local_e4) {
      uVar6 = local_d4 + 1;
      pJVar3 = (*input_buf)[local_d4];
      ppJVar4 = local_e0 + 1;
      local_f8 = *local_e0;
      for (local_fc = 0; local_e0 = ppJVar4, local_d4 = uVar6, local_fc < uVar2;
          local_fc = local_fc + 1) {
        JVar1 = pJVar3[local_fc];
        *local_f8 = JVar1;
        local_f8[1] = JVar1;
        local_f8[2] = JVar1;
        local_f8[3] = 0xff;
        local_f8 = local_f8 + 4;
      }
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    uVar2 = cinfo->output_width;
    local_a4 = num_rows;
    local_a0 = output_buf;
    local_94 = input_row;
    while (local_a4 = local_a4 + -1, -1 < local_a4) {
      uVar6 = local_94 + 1;
      pJVar3 = (*input_buf)[local_94];
      ppJVar4 = local_a0 + 1;
      local_b8 = *local_a0;
      for (local_bc = 0; local_a0 = ppJVar4, local_94 = uVar6, local_bc < uVar2;
          local_bc = local_bc + 1) {
        JVar1 = pJVar3[local_bc];
        local_b8[1] = JVar1;
        local_b8[2] = JVar1;
        local_b8[3] = JVar1;
        *local_b8 = 0xff;
        local_b8 = local_b8 + 4;
      }
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    uVar2 = cinfo->output_width;
    input_row_local = num_rows;
    input_buf_local = (JSAMPIMAGE)output_buf;
    cinfo_local._4_4_ = input_row;
    while (input_row_local = input_row_local - 1, -1 < (int)input_row_local) {
      uVar6 = cinfo_local._4_4_ + 1;
      pJVar3 = (*input_buf)[cinfo_local._4_4_];
      pppJVar5 = input_buf_local + 1;
      ppJStack_78 = *input_buf_local;
      for (local_7c = 0; input_buf_local = pppJVar5, cinfo_local._4_4_ = uVar6, local_7c < uVar2;
          local_7c = local_7c + 1) {
        JVar1 = pJVar3[local_7c];
        *(JSAMPLE *)((long)ppJStack_78 + 3) = JVar1;
        *(JSAMPLE *)((long)ppJStack_78 + 2) = JVar1;
        *(JSAMPLE *)((long)ppJStack_78 + 1) = JVar1;
        *(undefined1 *)ppJStack_78 = 0xff;
        ppJStack_78 = (JSAMPARRAY)((long)ppJStack_78 + 4);
      }
    }
    break;
  default:
    uVar2 = cinfo->output_width;
    local_24 = num_rows;
    local_20 = output_buf;
    local_14 = input_row;
    while (local_24 = local_24 + -1, -1 < local_24) {
      uVar6 = local_14 + 1;
      pJVar3 = (*input_buf)[local_14];
      ppJVar4 = local_20 + 1;
      local_38 = *local_20;
      for (inptr._4_4_ = 0; local_20 = ppJVar4, local_14 = uVar6, inptr._4_4_ < uVar2;
          inptr._4_4_ = inptr._4_4_ + 1) {
        JVar1 = pJVar3[inptr._4_4_];
        local_38[2] = JVar1;
        local_38[1] = JVar1;
        *local_38 = JVar1;
        local_38 = local_38 + 3;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                 JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    gray_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    gray_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_BGR:
    gray_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    gray_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    gray_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    gray_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  default:
    gray_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                              num_rows);
    break;
  }
}